

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::Int64Size(RepeatedField<long> *value)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)value->current_size_;
  if (value->current_size_ < 1) {
    uVar3 = uVar4;
  }
  sVar2 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = *(ulong *)((long)value->arena_or_elements_ + uVar4 * 8) | 1;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar1 * 9 + 0x49U >> 6);
  }
  return sVar2;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}